

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCheckedActualCall_unExpectedCallOnObject_TestShell::createTest
          (TEST_MockCheckedActualCall_unExpectedCallOnObject_TestShell *this)

{
  TEST_MockCheckedActualCall_unExpectedCallOnObject_Test *this_00;
  TEST_MockCheckedActualCall_unExpectedCallOnObject_TestShell *this_local;
  
  this_00 = (TEST_MockCheckedActualCall_unExpectedCallOnObject_Test *)
            operator_new(0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockActualCallTest.cpp"
                         ,0x56);
  TEST_MockCheckedActualCall_unExpectedCallOnObject_Test::
  TEST_MockCheckedActualCall_unExpectedCallOnObject_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockCheckedActualCall, unExpectedCallOnObject)
{
    int object;

    MockCheckedActualCall actualCall(1, reporter, *emptyList);
    actualCall.withName("unexpected").onObject(&object);

    MockUnexpectedCallHappenedFailure expectedFailure(mockFailureTest(), "unexpected", *list);
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);

    CHECK(actualCall.hasFailed()); // Checks that onObject() doesn't "reset" call state
}